

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O3

void __thiscall OpenMD::ZConstraintForceModifier::zeroVelocity(ZConstraintForceModifier *this)

{
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *plVar1;
  Molecule *pMVar2;
  pointer ppSVar3;
  StuntDouble *pSVar4;
  long lVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  double dVar8;
  pointer ppSVar9;
  _List_node_base *p_Var10;
  pointer ppMVar11;
  _List_node_base *p_Var12;
  pointer ppMVar13;
  RealType RVar14;
  double dVar15;
  Vector3d local_40;
  
  p_Var10 = (this->fixedZMols_).
            super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var10 != (_List_node_base *)&this->fixedZMols_) {
    do {
      pMVar2 = (Molecule *)p_Var10[1]._M_next;
      Molecule::getComVel(&local_40,pMVar2);
      ppSVar9 = (pMVar2->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppSVar3 = (pMVar2->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppSVar9 != ppSVar3) {
        pSVar4 = *ppSVar9;
        while (pSVar4 != (StuntDouble *)0x0) {
          ppSVar9 = ppSVar9 + 1;
          lVar5 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).velocity.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
          *(double *)(lVar5 + 0x10 + (long)pSVar4->localIndex_ * 0x18) =
               *(double *)(lVar5 + 0x10 + (long)pSVar4->localIndex_ * 0x18) -
               local_40.super_Vector<double,_3U>.data_[2];
          if (ppSVar9 == ppSVar3) break;
          pSVar4 = *ppSVar9;
        }
      }
      p_Var10 = p_Var10->_M_next;
    } while (p_Var10 != (_List_node_base *)&this->fixedZMols_);
  }
  plVar1 = &this->movingZMols_;
  p_Var10 = (this->movingZMols_).
            super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  dVar15 = 0.0;
  if (p_Var10 != (_List_node_base *)plVar1) {
    do {
      pMVar2 = (Molecule *)p_Var10[1]._M_next;
      Molecule::getComVel(&local_40,pMVar2);
      dVar8 = local_40.super_Vector<double,_3U>.data_[2];
      RVar14 = Molecule::getMass(pMVar2);
      dVar15 = dVar15 + RVar14 * dVar8;
      p_Var10 = p_Var10->_M_next;
    } while (p_Var10 != (_List_node_base *)plVar1);
  }
  ppMVar13 = (this->unzconsMols_).
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppMVar13 !=
      (this->unzconsMols_).
      super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pMVar2 = *ppMVar13;
      Molecule::getComVel(&local_40,pMVar2);
      dVar8 = local_40.super_Vector<double,_3U>.data_[2];
      RVar14 = Molecule::getMass(pMVar2);
      dVar15 = dVar15 + RVar14 * dVar8;
      ppMVar13 = ppMVar13 + 1;
    } while (ppMVar13 !=
             (this->unzconsMols_).
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  dVar15 = dVar15 / (this->totMassMovingZMols_ + this->totMassUnconsMols_);
  p_Var10 = (this->movingZMols_).
            super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var10 == (_List_node_base *)plVar1) {
      ppMVar11 = (this->unzconsMols_).
                 super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      do {
        if (ppMVar11 == ppMVar13) {
          return;
        }
        ppSVar9 = ((*ppMVar11)->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppSVar3 = ((*ppMVar11)->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppSVar9 != ppSVar3) {
          pSVar4 = *ppSVar9;
          while (pSVar4 != (StuntDouble *)0x0) {
            ppSVar9 = ppSVar9 + 1;
            lVar5 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).velocity.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
            *(double *)(lVar5 + 0x10 + (long)pSVar4->localIndex_ * 0x18) =
                 *(double *)(lVar5 + 0x10 + (long)pSVar4->localIndex_ * 0x18) - dVar15;
            if (ppSVar9 == ppSVar3) break;
            pSVar4 = *ppSVar9;
          }
        }
        ppMVar11 = ppMVar11 + 1;
      } while( true );
    }
    p_Var12 = p_Var10[1]._M_next[10]._M_next;
    p_Var6 = *(_List_node_base **)((long)(p_Var10[1]._M_next + 10) + 8);
    if (p_Var12 != p_Var6) {
      p_Var7 = p_Var12->_M_next;
      while (p_Var7 != (_List_node_base *)0x0) {
        p_Var12 = (_List_node_base *)&p_Var12->_M_prev;
        lVar5 = *(long *)((long)(*(_List_node_base **)
                                  ((long)(*(_List_node_base **)((long)(p_Var7 + 1) + 8) + 1) + 8) +
                                1) + 8U + (long)p_Var7[1]._M_next);
        *(double *)(lVar5 + 0x10 + (long)*(int *)&p_Var7[3]._M_next * 0x18) =
             *(double *)(lVar5 + 0x10 + (long)*(int *)&p_Var7[3]._M_next * 0x18) - dVar15;
        if (p_Var12 == p_Var6) break;
        p_Var7 = p_Var12->_M_next;
      }
    }
    p_Var10 = p_Var10->_M_next;
  } while( true );
}

Assistant:

void ZConstraintForceModifier::zeroVelocity() {
    Vector3d comVel;
    Vector3d vel;
    std::list<ZconstraintMol>::iterator i;
    Molecule* mol;
    StuntDouble* sd;
    Molecule::IntegrableObjectIterator ii;

    // Zero out the velocities of center of mass of fixed
    // z-constrained molecules
    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      mol    = i->mol;
      comVel = mol->getComVel();

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        vel = sd->getVel();
        vel[whichDirection] -= comVel[whichDirection];
        sd->setVel(vel);
      }
    }

    // Calculate the vz of center of mass of moving molecules
    // (including unconstrained molecules and moving z-constrained
    // molecules)

    RealType pzMovingMols = 0.0;

    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol    = i->mol;
      comVel = mol->getComVel();
      pzMovingMols += mol->getMass() * comVel[whichDirection];
    }

    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol    = *j;
      comVel = mol->getComVel();
      pzMovingMols += mol->getMass() * comVel[whichDirection];
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &pzMovingMols, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    RealType vzMovingMols =
        pzMovingMols / (totMassMovingZMols_ + totMassUnconsMols_);

    // Modify the velocities of moving z-constrained molecules

    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol = i->mol;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        vel = sd->getVel();
        vel[whichDirection] -= vzMovingMols;
        sd->setVel(vel);
      }
    }

    // Modify the velocites of unconstrained molecules
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol = *j;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        vel = sd->getVel();
        vel[whichDirection] -= vzMovingMols;
        sd->setVel(vel);
      }
    }
  }